

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_iso9660.c
# Opt level: O0

int isoent_clone_tree(archive_write *a,isoent **nroot,isoent *root)

{
  isoent *child;
  isoent *newent;
  isoent *xroot;
  isoent *np;
  isoent *root_local;
  isoent **nroot_local;
  archive_write *a_local;
  
  newent = (isoent *)0x0;
  xroot = root;
  do {
    child = isoent_clone(xroot);
    if (child == (isoent *)0x0) {
      archive_set_error(&a->archive,0xc,"Can\'t allocate memory");
      return -0x1e;
    }
    if (newent == (isoent *)0x0) {
      *nroot = child;
      child->parent = child;
      newent = child;
    }
    else {
      isoent_add_child_tail(newent,child);
    }
    if (((char)(xroot->field_0xe8 << 6) < '\0') && ((xroot->children).first != (isoent *)0x0)) {
      xroot = (xroot->children).first;
      newent = child;
    }
    else {
      for (; xroot != xroot->parent; xroot = xroot->parent) {
        if (xroot->chnext != (isoent *)0x0) {
          xroot = xroot->chnext;
          break;
        }
        newent = newent->parent;
      }
    }
    if (xroot == xroot->parent) {
      return 0;
    }
  } while( true );
}

Assistant:

static int
isoent_clone_tree(struct archive_write *a, struct isoent **nroot,
    struct isoent *root)
{
	struct isoent *np, *xroot, *newent;

	np = root;
	xroot = NULL;
	do {
		newent = isoent_clone(np);
		if (newent == NULL) {
			archive_set_error(&a->archive, ENOMEM,
			    "Can't allocate memory");
			return (ARCHIVE_FATAL);
		}
		if (xroot == NULL) {
			*nroot = xroot = newent;
			newent->parent = xroot;
		} else
			isoent_add_child_tail(xroot, newent);
		if (np->dir && np->children.first != NULL) {
			/* Enter to sub directories. */
			np = np->children.first;
			xroot = newent;
			continue;
		}
		while (np != np->parent) {
			if (np->chnext == NULL) {
				/* Return to the parent directory. */
				np = np->parent;
				xroot = xroot->parent;
			} else {
				np = np->chnext;
				break;
			}
		}
	} while (np != np->parent);

	return (ARCHIVE_OK);
}